

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O2

TestFuncExecutorBase * trun::TestFuncExecutorFactory::Create(Ref *library)

{
  TestExecutiontype TVar1;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  Config *pCVar4;
  TestFuncExecutorParallel *pTVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> _Stack_68;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  p_Var6 = &_Stack_68;
  if (Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor == '\0') {
    iVar3 = __cxa_guard_acquire(&Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor);
    if (iVar3 != 0) {
      __cxa_atexit(TestFuncExecutorBase::~TestFuncExecutorBase,&Create::sequentialExecutor,
                   &__dso_handle);
      __cxa_guard_release(&Create(std::shared_ptr<trun::IDynLibrary>)::sequentialExecutor);
    }
  }
  if (Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutor == '\0') {
    iVar3 = __cxa_guard_acquire(&Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutor);
    if (iVar3 != 0) {
      __cxa_atexit(TestFuncExecutorBase::~TestFuncExecutorBase,&Create::parallelExecutor,
                   &__dso_handle);
      __cxa_guard_release(&Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutor);
    }
  }
  if (Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutorPThread == '\0') {
    iVar3 = __cxa_guard_acquire(&Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutorPThread
                               );
    if (iVar3 != 0) {
      __cxa_atexit(TestFuncExecutorBase::~TestFuncExecutorBase,&Create::parallelExecutorPThread,
                   &__dso_handle);
      __cxa_guard_release(&Create(std::shared_ptr<trun::IDynLibrary>)::parallelExecutorPThread);
    }
  }
  pCVar4 = Config::Instance();
  TVar1 = pCVar4->testExecutionType;
  if (TVar1 == kThreadedWithExit) {
    this = &local_58._M_refcount;
    std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,&library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>
              );
    std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::parallelExecutorPThread.super_TestFuncExecutorSequential.
                super_TestFuncExecutorBase.library.
                super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>,&local_58);
    pTVar5 = (TestFuncExecutorParallel *)&Create::parallelExecutorPThread;
    goto LAB_0011bd88;
  }
  if (TVar1 == kThreaded) {
    p_Var2 = &local_48;
    p_Var6 = &local_48;
LAB_0011bcf7:
    this = &p_Var2->_M_refcount;
    std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (p_Var6,&library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::parallelExecutor.super_TestFuncExecutorSequential.super_TestFuncExecutorBase
                .library.super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
    pTVar5 = &Create::parallelExecutor;
  }
  else {
    if (TVar1 == kSequential) {
      pCVar4 = Config::Instance();
      if (pCVar4->isSubProcess == true) {
        p_Var2 = &local_28;
        p_Var6 = &local_28;
        goto LAB_0011bcf7;
      }
      p_Var2 = &local_38;
      p_Var6 = &local_38;
    }
    else {
      p_Var2 = &_Stack_68;
      puts("Unknown or unsupported test execution model, using default");
    }
    this = &p_Var2->_M_refcount;
    std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (p_Var6,&library->super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&Create::sequentialExecutor.super_TestFuncExecutorBase.library.
                super___shared_ptr<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2>,p_Var6);
    pTVar5 = (TestFuncExecutorParallel *)&Create::sequentialExecutor;
  }
LAB_0011bd88:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this);
  return (TestFuncExecutorBase *)(TestFuncExecutorParallelPThread *)pTVar5;
}

Assistant:

TestFuncExecutorBase &TestFuncExecutorFactory::Create(IDynLibrary::Ref library) {
    static TestFuncExecutorSequential sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
    static TestFuncExecutorParallel parallelExecutor;
    static TestFuncExecutorParallelPThread parallelExecutorPThread;
#endif

    switch(Config::Instance().testExecutionType) {
        case TestExecutiontype::kSequential :
            // In case we are a sub-process, we run in threads anyway  <- should we?
#ifdef TRUN_HAVE_THREADS
            if (Config::Instance().isSubProcess) {
                parallelExecutor.SetLibrary(library);
                return parallelExecutor;
            }
#endif
            sequentialExecutor.SetLibrary(library);
            return sequentialExecutor;
#ifdef TRUN_HAVE_THREADS
        case TestExecutiontype::kThreaded :
            parallelExecutor.SetLibrary(library);
            return parallelExecutor;
        case TestExecutiontype::kThreadedWithExit :
            parallelExecutorPThread.SetLibrary(library);
            return parallelExecutorPThread;
#endif
        default:
            printf("Unknown or unsupported test execution model, using default\n");
            break;
    }
    // Always available
    sequentialExecutor.SetLibrary(library);
    return sequentialExecutor;
}